

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

Compaction * __thiscall
leveldb::VersionSet::CompactRange(VersionSet *this,int level,InternalKey *begin,InternalKey *end)

{
  int *piVar1;
  Version *pVVar2;
  Compaction *this_00;
  size_type __new_size;
  ulong uVar3;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> inputs;
  _Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Version::GetOverlappingInputs
            (this->current_,level,begin,end,
             (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)&local_38)
  ;
  if (local_38._M_impl.super__Vector_impl_data._M_start ==
      local_38._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (Compaction *)0x0;
  }
  else {
    if (0 < level) {
      uVar3 = 0;
      __new_size = 0;
      do {
        if ((long)local_38._M_impl.super__Vector_impl_data._M_finish -
            (long)local_38._M_impl.super__Vector_impl_data._M_start >> 3 == __new_size)
        goto LAB_0010d524;
        uVar3 = uVar3 + local_38._M_impl.super__Vector_impl_data._M_start[__new_size]->file_size;
        __new_size = __new_size + 1;
      } while (uVar3 < this->options_->max_file_size);
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::resize
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 &local_38,__new_size);
    }
LAB_0010d524:
    this_00 = (Compaction *)operator_new(0x158);
    Compaction::Compaction(this_00,this->options_,level);
    pVVar2 = this->current_;
    this_00->input_version_ = pVVar2;
    piVar1 = &pVVar2->refs_;
    *piVar1 = *piVar1 + 1;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator=
              (this_00->inputs_,
               (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               &local_38);
    SetupOtherInputs(this,this_00);
  }
  std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
  ~_Vector_base(&local_38);
  return this_00;
}

Assistant:

Compaction* VersionSet::CompactRange(int level, const InternalKey* begin,
                                     const InternalKey* end) {
  std::vector<FileMetaData*> inputs;
  current_->GetOverlappingInputs(level, begin, end, &inputs);
  if (inputs.empty()) {
    return nullptr;
  }

  // Avoid compacting too much in one shot in case the range is large.
  // But we cannot do this for level-0 since level-0 files can overlap
  // and we must not pick one file and drop another older file if the
  // two files overlap.
  if (level > 0) {
    const uint64_t limit = MaxFileSizeForLevel(options_, level);
    uint64_t total = 0;
    for (size_t i = 0; i < inputs.size(); i++) {
      uint64_t s = inputs[i]->file_size;
      total += s;
      if (total >= limit) {
        inputs.resize(i + 1);
        break;
      }
    }
  }

  Compaction* c = new Compaction(options_, level);
  c->input_version_ = current_;
  c->input_version_->Ref();
  c->inputs_[0] = inputs;
  SetupOtherInputs(c);
  return c;
}